

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen11Resource_TestPlanar2D_NV12_MediaCompressed_Test::
~CTestGen11Resource_TestPlanar2D_NV12_MediaCompressed_Test
          (CTestGen11Resource_TestPlanar2D_NV12_MediaCompressed_Test *this)

{
  CTestGen9Resource::~CTestGen9Resource((CTestGen9Resource *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CTestGen11Resource, TestPlanar2D_NV12_MediaCompressed)
{
    /* Test planar surface with hybrid UV planes where UV plane is half the size
    of Y and U/V data is packed together */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // [UV-Packing]
    // YccsYccsYccs
    // YccsYccsYccs
    // UVccsUVccsUVccs
    // UVccsUVccsUVccs

    const uint32_t TileSize[2] = {128, 32}; // TileY

    GMM_RESCREATE_PARAMS gmmParams        = {};
    gmmParams.Type                        = RESOURCE_2D;
    gmmParams.NoGfxMemory                 = 1;
    gmmParams.Flags.Gpu.MMC               = 1;
    gmmParams.Flags.Gpu.Texture           = 1;
    gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;
    gmmParams.Flags.Info.TiledY           = 1;
    gmmParams.BaseWidth64                 = 0x2048; //8264
    gmmParams.BaseHeight                  = 0x274;  // 628
    gmmParams.Depth                       = 0x1;
    SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(TEST_TILEY));
    gmmParams.Format = GMM_FORMAT_NV12;

    GMM_RESOURCE_INFO *ResourceInfo;
    //__debugbreak();
    ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

    uint32_t Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[0]);

    uint32_t Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]) +
                   GMM_ULT_ALIGN(gmmParams.BaseHeight / 2, TileSize[1]);
    uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

    VerifyResourcePitch<true>(ResourceInfo, Pitch);
    VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[0]);

    VerifyResourceSize<true>(ResourceInfo, Size);
    VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

    // Y plane should be at 0,0
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
    EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

    // U/V plane should be at end of Y plane
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));

    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

    // Y Plane CCS should be at the end of NV12 surface.
    EXPECT_EQ(Size, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS));
    EXPECT_EQ(Size, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_Y_CCS));

    // UV Plane CCS offset
    uint32_t YCcsSize = GMM_ULT_ALIGN(((GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]) * Pitch) / 1024), PAGE_SIZE);
    EXPECT_EQ(Size + YCcsSize, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_UV_CCS));

    uint32_t UVCcsSize        = GMM_ULT_ALIGN((Height - GFX_ALIGN(gmmParams.BaseHeight, TileSize[1])) * Pitch / 1024, PAGE_SIZE);
    uint32_t MediaStateOffset = Size + YCcsSize + UVCcsSize;
    EXPECT_EQ(MediaStateOffset, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_COMP_STATE));

    pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
}